

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.h
# Opt level: O1

void set_pstate_bits(TCGContext_conflict1 *tcg_ctx,uint32_t bits)

{
  TCGTemp *ts;
  
  ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i32,(TCGArg)ts,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                      0x148);
  tcg_gen_ori_i32_aarch64
            (tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),(TCGv_i32)((long)ts - (long)tcg_ctx),bits)
  ;
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i32,(TCGArg)ts,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                      0x148);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts);
  return;
}

Assistant:

static inline void set_pstate_bits(TCGContext *tcg_ctx, uint32_t bits)
{
    TCGv_i32 p = tcg_temp_new_i32(tcg_ctx);

    tcg_debug_assert(!(bits & CACHED_PSTATE_BITS));

    tcg_gen_ld_i32(tcg_ctx, p, tcg_ctx->cpu_env, offsetof(CPUARMState, pstate));
    tcg_gen_ori_i32(tcg_ctx, p, p, bits);
    tcg_gen_st_i32(tcg_ctx, p, tcg_ctx->cpu_env, offsetof(CPUARMState, pstate));
    tcg_temp_free_i32(tcg_ctx, p);
}